

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

void __thiscall
Memory::SegmentBase<Memory::VirtualAllocWrapper>::~SegmentBase
          (SegmentBase<Memory::VirtualAllocWrapper> *this)

{
  uint uVar1;
  undefined4 *puVar2;
  char *pcVar3;
  PageAllocatorBaseCommon *pPVar4;
  code *pcVar5;
  bool bVar6;
  AllocatorType *pAVar7;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t numPages;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_00;
  undefined8 *in_FS_OFFSET;
  
  if ((this->super_SegmentBaseCommon).allocator == (PageAllocatorBaseCommon *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x39,"(this->allocator != nullptr)","this->allocator != nullptr");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar2 = 0;
  }
  if (this->secondaryAllocator != (SecondaryAllocator *)0x0) {
    (*this->secondaryAllocator->_vptr_SecondaryAllocator[2])();
    this->secondaryAllocator = (SecondaryAllocator *)0x0;
  }
  pcVar3 = this->address;
  if (pcVar3 != (char *)0x0) {
    uVar1 = this->leadingGuardPageCount;
    pPVar4 = (this->super_SegmentBaseCommon).allocator;
    this_00 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
               *)&pPVar4[-1].allocatorType;
    if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
      this_00 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 *)0x0;
    }
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::GetVirtualAllocator(this_00);
    VirtualAllocWrapper::Free
              ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,pcVar3 + -(ulong)(uVar1 << 0xc)
               ,this->segmentPageCount << 0xc,0x8000);
    pPVar4 = (this->super_SegmentBaseCommon).allocator;
    pAVar7 = &pPVar4[-1].allocatorType;
    if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
      pAVar7 = (AllocatorType *)0x0;
    }
    numPages = extraout_RDX;
    if (*(AllocationPolicyManager **)(pAVar7 + 0x32) != (AllocationPolicyManager *)0x0) {
      AllocationPolicyManager::ReportFree
                (*(AllocationPolicyManager **)(pAVar7 + 0x32),this->segmentPageCount << 0xc);
      numPages = extraout_RDX_00;
    }
    if ((Js::Configuration::Global[0x2c154] == '\x01') && ((this->field_0x2c & 2) != 0)) {
      RecyclerWriteBarrierManager::ToggleBarrier(this->address,this->segmentPageCount << 0xc,false);
      numPages = extraout_RDX_01;
    }
    RecyclerWriteBarrierManager::OnSegmentFree
              ((RecyclerWriteBarrierManager *)this->address,(char *)this->segmentPageCount,numPages)
    ;
  }
  return;
}

Assistant:

SegmentBase<T>::~SegmentBase()
{
    Assert(this->allocator != nullptr);

    // Cleanup secondaryAllocator before releasing pages so the destructor
    // still has access to segment memory.
    if(this->secondaryAllocator)
    {
        this->secondaryAllocator->Delete();
        this->secondaryAllocator = nullptr;
    }

    if (this->address)
    {
        char* originalAddress = this->address - (leadingGuardPageCount * AutoSystemInfo::PageSize);
        GetAllocator()->GetVirtualAllocator()->Free(originalAddress, GetPageCount() * AutoSystemInfo::PageSize, MEM_RELEASE);
        GetAllocator()->ReportFree(this->segmentPageCount * AutoSystemInfo::PageSize); //Note: We reported the guard pages free when we decommitted them during segment initialization
#if defined(TARGET_64) && defined(RECYCLER_WRITE_BARRIER_BYTE)
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (CONFIG_FLAG(StrictWriteBarrierCheck) && this->isWriteBarrierEnabled)
        {
            RecyclerWriteBarrierManager::ToggleBarrier(this->address, this->segmentPageCount * AutoSystemInfo::PageSize, false);
        }
#endif
        RecyclerWriteBarrierManager::OnSegmentFree(this->address, this->segmentPageCount);
#endif
    }
}